

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_utils.cc
# Opt level: O0

bool sptk::MakePseudoQuadratureMirrorFilterBanks
               (bool inverse,int num_subband,int num_filter_order,double attenuation,
               int num_iteration,double convergence_threshold,double initial_step_size,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *filter_banks,bool *is_converged)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  const_iterator cVar5;
  iterator iVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> this;
  reference pvVar7;
  reference this_00;
  reference pvVar8;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte in_DIL;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_R8;
  undefined1 *in_R9;
  double in_XMM0_Qa;
  double dVar9;
  double dVar10;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  double in_XMM2_Qa;
  double c;
  double b;
  double a;
  int n_1;
  double *h_1;
  double *p;
  int k;
  int sign_1;
  int sign;
  double abs_error;
  double error;
  double x;
  int n;
  double *h;
  int i;
  double best_abs_error;
  double step_size;
  double omega;
  int index;
  vector<double,_std::allocator<double>_> imag;
  vector<double,_std::allocator<double>_> real;
  vector<double,_std::allocator<double>_> ideal_filter;
  Buffer buffer_for_fft;
  RealValuedFastFourierTransform fft;
  int fft_size;
  vector<double,_std::allocator<double>_> *window;
  KaiserWindow kaiser_window;
  vector<double,_std::allocator<double>_> prototype_filter;
  int filter_size;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcf8;
  RealValuedFastFourierTransform *in_stack_fffffffffffffd00;
  allocator_type *in_stack_fffffffffffffd10;
  value_type in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  undefined8 in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  KaiserWindow *this_01;
  int local_25c;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  int iVar11;
  undefined4 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdc8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffdd0;
  int local_1ec;
  int local_1dc;
  vector<double,_std::allocator<double>_> *local_1d8;
  double local_1d0;
  double local_1c8;
  vector<double,_std::allocator<double>_> local_1b8;
  vector<double,_std::allocator<double>_> local_1a0;
  vector<double,_std::allocator<double>_> local_180;
  int local_164;
  RealValuedFastFourierTransform local_128;
  int local_bc;
  vector<double,_std::allocator<double>_> *local_b8;
  KaiserWindow local_b0;
  undefined1 local_61 [29];
  int local_44;
  undefined1 *local_40;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_38;
  double local_30;
  double local_28;
  int local_1c;
  int local_c;
  int local_8;
  byte local_2;
  byte local_1;
  
  local_2 = in_DIL & 1;
  local_28 = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((((in_ESI == 0) || (in_EDX < 2)) || (in_XMM0_Qa <= 0.0)) ||
     (((in_ECX == 0 || (local_28 < 0.0)) ||
      ((in_XMM2_Qa <= 0.0 ||
       (in_R8 == (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)0x0)))))) {
    local_1 = 0;
  }
  else {
    if (in_R9 != (undefined1 *)0x0) {
      *in_R9 = 0;
    }
    local_44 = in_EDX + 1;
    iVar11 = local_44 >> 0x1f;
    this_01 = (KaiserWindow *)local_61;
    local_40 = in_R9;
    local_38 = in_R8;
    local_30 = in_XMM2_Qa;
    local_1c = in_ECX;
    local_c = in_EDX;
    local_8 = in_ESI;
    std::allocator<double>::allocator((allocator<double> *)0x116a61);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (size_type)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::allocator<double>::~allocator((allocator<double> *)0x116a8d);
    iVar2 = local_44;
    dVar9 = KaiserWindow::AttenuationToBeta((double)in_stack_fffffffffffffd10);
    KaiserWindow::KaiserWindow(this_01,iVar11,dVar9,SUB41((uint)iVar2 >> 0x18,0));
    local_b8 = KaiserWindow::Get(&local_b0);
    local_bc = NextPowTwo(local_44);
    RealValuedFastFourierTransform::RealValuedFastFourierTransform
              ((RealValuedFastFourierTransform *)
               CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),
               (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38);
    RealValuedFastFourierTransform::Buffer::Buffer((Buffer *)in_stack_fffffffffffffd00);
    bVar1 = RealValuedFastFourierTransform::IsValid(&local_128);
    if (bVar1) {
      std::allocator<double>::allocator((allocator<double> *)0x116c15);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                 (size_type)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::allocator<double>::~allocator((allocator<double> *)0x116c3b);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x116c48);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x116c55);
      iVar2 = local_bc / (local_8 << 2);
      local_1c8 = 3.141592653589793 / (double)(local_8 << 1);
      local_1d0 = local_30;
      local_1d8 = (vector<double,_std::allocator<double>_> *)0x7fefffffffffffff;
      for (local_1dc = 0; local_1dc < local_1c; local_1dc = local_1dc + 1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_180,0);
        for (local_1ec = 0; local_1ec < local_44; local_1ec = local_1ec + 1) {
          dVar9 = (double)local_c * -0.5 + (double)local_1ec;
          dVar10 = sin(local_1c8 * dVar9);
          pvVar7[local_1ec] = dVar10 / (dVar9 * 3.141592653589793);
        }
        bVar1 = IsEven(local_44);
        if (!bVar1) {
          pvVar7[local_c / 2] = local_1c8 / 3.141592653589793;
        }
        iVar3 = std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffcf8);
        iVar4 = std::vector<double,_std::allocator<double>_>::end(in_stack_fffffffffffffcf8);
        cVar5 = std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffcf8);
        iVar6 = std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffffcf8);
        this = std::
               transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::MakePseudoQuadratureMirrorFilterBanks(bool,int,int,double,int,double,double,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>*,bool*)::__0>
                         (iVar3._M_current,iVar4._M_current,cVar5._M_current,iVar6._M_current);
        in_stack_fffffffffffffd27 =
             RealValuedFastFourierTransform::Run
                       ((RealValuedFastFourierTransform *)this._M_current,in_stack_fffffffffffffdd0,
                        in_stack_fffffffffffffdc8,
                        (vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                        (Buffer *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
        if (!(bool)in_stack_fffffffffffffd27) {
          local_1 = 0;
          local_164 = 1;
          goto LAB_00117114;
        }
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_1a0,(long)iVar2);
        in_stack_fffffffffffffd10 = (allocator_type *)*pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_1a0,(long)iVar2);
        in_stack_fffffffffffffd18 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_1b8,(long)iVar2);
        dVar9 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_1b8,(long)iVar2);
        in_stack_fffffffffffffdd0 =
             (vector<double,_std::allocator<double>_> *)
             (((double)in_stack_fffffffffffffd10 * in_stack_fffffffffffffd18 + dVar9 * *pvVar7) -
             0.5);
        in_stack_fffffffffffffdc8 =
             (vector<double,_std::allocator<double>_> *)ABS((double)in_stack_fffffffffffffdd0);
        if ((double)in_stack_fffffffffffffdc8 < local_28) {
          if (local_40 != (undefined1 *)0x0) {
            *local_40 = 1;
          }
          break;
        }
        in_stack_fffffffffffffdc4 = 1;
        if (0.0 < (double)in_stack_fffffffffffffdd0) {
          in_stack_fffffffffffffdc4 = -1;
        }
        if ((double)local_1d8 <= (double)in_stack_fffffffffffffdc8) {
          local_1d0 = local_1d0 * 0.5;
          dVar9 = (double)in_stack_fffffffffffffdc4 * local_1d0;
        }
        else {
          dVar9 = (double)in_stack_fffffffffffffdc4 * local_1d0;
          local_1d8 = in_stack_fffffffffffffdc8;
        }
        local_1c8 = dVar9 + local_1c8;
      }
      local_164 = 0;
LAB_00117114:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10);
    }
    else {
      local_1 = 0;
      local_164 = 1;
    }
    RealValuedFastFourierTransform::Buffer::~Buffer((Buffer *)in_stack_fffffffffffffd00);
    RealValuedFastFourierTransform::~RealValuedFastFourierTransform(in_stack_fffffffffffffd00);
    KaiserWindow::~KaiserWindow((KaiserWindow *)in_stack_fffffffffffffd00);
    if (local_164 == 0) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (size_type)in_stack_fffffffffffffd18);
      iVar2 = 1;
      if ((local_2 & 1) != 0) {
        iVar2 = -1;
      }
      for (iVar11 = 0; iVar11 < local_8; iVar11 = iVar11 + 1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](local_38,(long)iVar11);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                   (size_type)in_stack_fffffffffffffd18);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_61 + 1),0);
        this_00 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](local_38,(long)iVar11);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
        for (local_25c = 0; local_25c < local_44; local_25c = local_25c + 1) {
          dVar9 = pvVar7[local_25c] * 2.0;
          dVar10 = cos((((double)(iVar11 * 2 + 1) * 3.141592653589793) / (double)(local_8 << 1)) *
                       ((double)local_c * -0.5 + (double)local_25c) +
                       (double)iVar2 * 0.25 * 3.141592653589793);
          pvVar8[local_25c] = dVar9 * dVar10;
        }
        iVar2 = -iVar2;
      }
      local_1 = 1;
      local_164 = 1;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MakePseudoQuadratureMirrorFilterBanks(
    bool inverse, int num_subband, int num_filter_order, double attenuation,
    int num_iteration, double convergence_threshold, double initial_step_size,
    std::vector<std::vector<double> >* filter_banks, bool* is_converged) {
  if (0 == num_subband || num_filter_order <= 1 || attenuation <= 0.0 ||
      0 == num_iteration || convergence_threshold < 0.0 ||
      initial_step_size <= 0.0 || NULL == filter_banks) {
    return false;
  }

  if (is_converged) *is_converged = false;

  // Design prototype filter.
  const int filter_size(num_filter_order + 1);
  std::vector<double> prototype_filter(filter_size);
  {
    // Make Kaiser window.
    const sptk::KaiserWindow kaiser_window(
        filter_size, sptk::KaiserWindow::AttenuationToBeta(attenuation), false);
    const std::vector<double>& window(kaiser_window.Get());

    // Prepare FFT.
    const int fft_size(sptk::NextPowTwo(filter_size));
    sptk::RealValuedFastFourierTransform fft(num_filter_order, fft_size);
    sptk::RealValuedFastFourierTransform::Buffer buffer_for_fft;
    if (!fft.IsValid()) {
      return false;
    }

    std::vector<double> ideal_filter(filter_size);
    std::vector<double> real;
    std::vector<double> imag;
    const int index(fft_size / (4 * num_subband));

    // Initialize.
    double omega(sptk::kPi / (2 * num_subband));
    double step_size(initial_step_size);
    double best_abs_error(sptk::kMax);

    for (int i(0); i < num_iteration; ++i) {
      // Make ideal filter.
      {
        double* h(&(ideal_filter[0]));
        for (int n(0); n < filter_size; ++n) {
          const double x(n - 0.5 * num_filter_order);
          h[n] = std::sin(omega * x) / (sptk::kPi * x);
        }
        // Avoid NaN using L'Hopital's rule.
        if (!sptk::IsEven(filter_size))
          h[num_filter_order / 2] = omega / sptk::kPi;
      }

      // Make prototype filter.
      std::transform(ideal_filter.begin(), ideal_filter.end(), window.begin(),
                     prototype_filter.begin(),
                     [](double h, double w) { return h * w; });

      // Get frequency response of the prototype filter.
      if (!fft.Run(prototype_filter, &real, &imag, &buffer_for_fft)) {
        return false;
      }

      // Calculate error.
      const double error(real[index] * real[index] + imag[index] * imag[index] -
                         0.5);
      const double abs_error(std::fabs(error));
      if (abs_error < convergence_threshold) {
        if (is_converged) *is_converged = true;
        break;
      }

      // Update angular frequency.
      const int sign((0 < error) ? -1 : 1);
      if (abs_error < best_abs_error) {
        omega += sign * step_size;
        best_abs_error = abs_error;
      } else {
        step_size *= 0.5;  // Drop step size by half (heuristic).
        omega += sign * step_size;
      }
    }
  }

  // Make filter banks.
  {
    filter_banks->resize(num_subband);
    int sign(inverse ? -1 : 1);
    for (int k(0); k < num_subband; ++k) {
      (*filter_banks)[k].resize(filter_size);
      const double* p(&(prototype_filter[0]));
      double* h(&((*filter_banks)[k][0]));
      for (int n(0); n < filter_size; ++n) {
        const double a((2 * k + 1) * sptk::kPi / (2 * num_subband) *
                       (n - 0.5 * num_filter_order));
        const double b(sign * 0.25 * sptk::kPi);
        const double c(2.0 * p[n]);
        h[n] = c * std::cos(a + b);
      }
      sign *= -1;
    }
  }
  return true;
}